

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

ostream * __thiscall tchecker::while_statement_t::output(while_statement_t *this,ostream *os)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *os_local;
  while_statement_t *this_local;
  
  std::operator<<(os,"while ");
  peVar1 = std::
           __shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_condition);
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::operator<<(os," do ");
  peVar2 = std::
           __shared_ptr_access<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_stmt);
  (*peVar2->_vptr_statement_t[4])(peVar2,os);
  std::operator<<(os," done");
  return os;
}

Assistant:

std::ostream & while_statement_t::output(std::ostream & os) const
{
  os << "while ";
  _condition->output(os);
  os << " do ";
  _stmt->output(os);
  os << " done";
  return os;
}